

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall protozero::TypedProtoDecoderBase::ExpandHeapStorage(TypedProtoDecoderBase *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  code *pcVar4;
  uint *puVar5;
  char *fname;
  int *piVar6;
  char *pcVar7;
  Field *__p;
  type pFVar8;
  uint32_t new_size;
  unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_> new_storage;
  uint local_14;
  uint32_t new_capacity;
  uint32_t min_capacity;
  TypedProtoDecoderBase *this_local;
  
  local_14 = this->num_fields_ + 0x800;
  new_storage._M_t.super___uniq_ptr_impl<protozero::Field,_std::default_delete<protozero::Field[]>_>
  ._M_t.super__Tuple_impl<0UL,_protozero::Field_*,_std::default_delete<protozero::Field[]>_>.
  super__Head_base<0UL,_protozero::Field_*,_false>._M_head_impl._4_4_ = this->capacity_ << 1;
  _new_capacity = this;
  puVar5 = perfetto::std::max<unsigned_int>
                     ((uint *)((long)&new_storage._M_t.
                                      super___uniq_ptr_impl<protozero::Field,_std::default_delete<protozero::Field[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_protozero::Field_*,_std::default_delete<protozero::Field[]>_>
                                      .super__Head_base<0UL,_protozero::Field_*,_false>._M_head_impl
                              + 4),&local_14);
  uVar1 = *puVar5;
  bVar3 = false;
  if (this->size_ < uVar1) {
    bVar3 = this->num_fields_ < uVar1;
  }
  if (bVar3) {
    __p = (Field *)operator_new__((ulong)uVar1 << 4);
    std::unique_ptr<protozero::Field[],std::default_delete<protozero::Field[]>>::
    unique_ptr<protozero::Field*,std::default_delete<protozero::Field[]>,void,bool>
              ((unique_ptr<protozero::Field[],std::default_delete<protozero::Field[]>> *)
               &stack0xffffffffffffffd8,__p);
    puVar5 = perfetto::std::max<unsigned_int>(&this->size_,&this->num_fields_);
    uVar2 = *puVar5;
    pFVar8 = perfetto::std::unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_>
             ::operator[]((unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_>
                           *)&stack0xffffffffffffffd8,(ulong)this->size_);
    memset(pFVar8,0,(ulong)(uVar2 - this->size_) << 4);
    pFVar8 = perfetto::std::unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_>
             ::operator[]((unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_>
                           *)&stack0xffffffffffffffd8,0);
    memcpy(pFVar8,this->fields_,(ulong)this->size_ << 4);
    perfetto::std::unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_>::
    operator=(&this->heap_storage_,
              (unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_> *)
              &stack0xffffffffffffffd8);
    pFVar8 = perfetto::std::unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_>
             ::operator[](&this->heap_storage_,0);
    this->fields_ = pFVar8;
    this->capacity_ = uVar1;
    this->size_ = uVar2;
    perfetto::std::unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_>::
    ~unique_ptr((unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_> *)
                &stack0xffffffffffffffd8);
    return;
  }
  fname = perfetto::base::Basename
                    (
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                    );
  puVar5 = (uint *)__errno_location();
  uVar1 = *puVar5;
  piVar6 = __errno_location();
  pcVar7 = strerror(*piVar6);
  perfetto::base::LogMessage
            (kLogError,fname,0x2847,"%s (errno: %d, %s)",
             "PERFETTO_CHECK(new_capacity > size_ && new_capacity > num_fields_)",(ulong)uVar1,
             pcVar7);
  perfetto::base::MaybeSerializeLastLogsForCrashReporting();
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

void TypedProtoDecoderBase::ExpandHeapStorage() {
  // When we expand the heap we must ensure that we have at very last capacity
  // to deal with all known fields plus at least one repeated field. We go +2048
  // here based on observations on a large 4GB android trace. This is to avoid
  // trivial re-allocations when dealing with repeated fields of a message that
  // has > INITIAL_STACK_CAPACITY fields.
  const uint32_t min_capacity = num_fields_ + 2048;  // Any num >= +1 will do.
  const uint32_t new_capacity = std::max(capacity_ * 2, min_capacity);
  PERFETTO_CHECK(new_capacity > size_ && new_capacity > num_fields_);
  std::unique_ptr<Field[]> new_storage(new Field[new_capacity]);

  static_assert(std::is_trivially_constructible<Field>::value,
                "Field must be trivially constructible");
  static_assert(std::is_trivially_copyable<Field>::value,
                "Field must be trivially copyable");

  // Zero-initialize the slots for known field IDs slots, as they can be
  // randomly accessed. Instead, there is no need to initialize the repeated
  // slots, because they are written linearly with no gaps and are always
  // initialized before incrementing |size_|.
  const uint32_t new_size = std::max(size_, num_fields_);
  memset(&new_storage[size_], 0, sizeof(Field) * (new_size - size_));

  memcpy(&new_storage[0], fields_, sizeof(Field) * size_);

  heap_storage_ = std::move(new_storage);
  fields_ = &heap_storage_[0];
  capacity_ = new_capacity;
  size_ = new_size;
}